

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool __thiscall CLI::App::remove_needs(App *this,App *app)

{
  set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_> *in_RDI;
  _Rb_tree_const_iterator<CLI::App_*> iterator;
  set<CLI::App_*,_std::less<CLI::App_*>,_std::allocator<CLI::App_*>_> *in_stack_ffffffffffffffa8;
  const_iterator in_stack_ffffffffffffffb8;
  _Rb_tree_const_iterator<CLI::App_*> in_stack_ffffffffffffffc0;
  _Rb_tree_const_iterator<CLI::App_*> in_stack_ffffffffffffffc8;
  _Self local_20 [3];
  bool local_1;
  
  ::std::begin<std::set<CLI::App*,std::less<CLI::App*>,std::allocator<CLI::App*>>>
            (in_stack_ffffffffffffffa8);
  ::std::end<std::set<CLI::App*,std::less<CLI::App*>,std::allocator<CLI::App*>>>
            (in_stack_ffffffffffffffa8);
  local_20[0]._M_node =
       (_Base_ptr)
       ::std::find<std::_Rb_tree_const_iterator<CLI::App*>,CLI::App*>
                 (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                  in_stack_ffffffffffffffb8._M_node);
  ::std::end<std::set<CLI::App*,std::less<CLI::App*>,std::allocator<CLI::App*>>>
            (in_stack_ffffffffffffffa8);
  local_1 = std::operator==(local_20,(_Self *)&stack0xffffffffffffffc8);
  if (!local_1) {
    ::std::set<CLI::App*,std::less<CLI::App*>,std::allocator<CLI::App*>>::erase_abi_cxx11_
              (in_RDI,in_stack_ffffffffffffffb8);
  }
  local_1 = !local_1;
  return local_1;
}

Assistant:

CLI11_INLINE bool App::remove_needs(App *app) {
    auto iterator = std::find(std::begin(need_subcommands_), std::end(need_subcommands_), app);
    if(iterator == std::end(need_subcommands_)) {
        return false;
    }
    need_subcommands_.erase(iterator);
    return true;
}